

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::CloudMediumProvider::Density(CloudMediumProvider *this,Point3f *p,SampledWavelengths *lambda)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Float FVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  float fVar17;
  Tuple3<pbrt::Point3,_float> local_e8;
  float local_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  Tuple3<pbrt::Point3,_float> local_a8;
  Tuple3<pbrt::Point3,_float> local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Float local_58;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  
  uVar1 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar2 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  fVar17 = this->extent * 5.0;
  local_b8 = (float)uVar1 * fVar17;
  fStack_b4 = (float)uVar2 * fVar17;
  fStack_b0 = fVar17 * 0.0;
  fStack_ac = fVar17 * 0.0;
  fVar17 = fVar17 * (p->super_Tuple3<pbrt::Point3,_float>).z;
  if (0.0 < this->wispiness) {
    fVar12 = this->wispiness * 0.05;
    local_c8 = 10.0;
    bVar6 = true;
    do {
      bVar7 = bVar6;
      uStack_c4 = 0;
      uStack_c0 = 0;
      uStack_bc = 0;
      fVar4 = fVar17 * local_c8;
      local_48 = ZEXT416((uint)fVar12);
      local_d8._0_4_ = local_b8 * local_c8;
      local_d8._4_4_ = fStack_b4 * local_c8;
      fStack_d0 = fStack_b0 * local_c8;
      fStack_cc = fStack_ac * local_c8;
      local_e8._0_8_ = vmovlps_avx(_local_d8);
      local_e8.z = fVar4;
      local_58 = Noise((Point3f *)&local_e8);
      local_e8.z = fVar4 + 0.0;
      local_78._0_4_ = (float)local_d8._0_4_ + 0.01;
      local_78._4_4_ = (float)local_d8._4_4_ + 0.0;
      local_78._8_4_ = fStack_d0 + 0.0;
      local_78._12_4_ = fStack_cc + 0.0;
      local_e8._0_8_ = vmovlps_avx(local_78);
      local_dc = local_e8.z;
      local_68 = Noise((Point3f *)&local_e8);
      auVar9 = vmovshdup_avx(_local_d8);
      local_88 = ZEXT416((uint)(local_d8._0_4_ + 0.0));
      auVar9 = vinsertps_avx(local_88,ZEXT416((uint)(auVar9._0_4_ + 0.01)),0x10);
      local_98._0_8_ = vmovlps_avx(auVar9);
      local_98.z = local_dc;
      uStack_64 = extraout_XMM0_Db;
      uStack_60 = extraout_XMM0_Dc;
      uStack_5c = extraout_XMM0_Dd;
      local_d8._0_4_ = Noise((Point3f *)&local_98);
      local_d8._4_4_ = extraout_XMM0_Db_00;
      fStack_d0 = (float)extraout_XMM0_Dc_00;
      fStack_cc = (float)extraout_XMM0_Dd_00;
      local_a8.z = fVar4 + 0.01;
      auVar9 = vblendps_avx(local_88,local_78,2);
      local_a8._0_8_ = vmovlps_avx(auVar9);
      FVar11 = Noise((Point3f *)&local_a8);
      auVar3._4_4_ = uStack_64;
      auVar3._0_4_ = local_68;
      auVar3._8_4_ = uStack_60;
      auVar3._12_4_ = uStack_5c;
      auVar9 = vinsertps_avx(auVar3,ZEXT416((uint)local_d8._0_4_),0x10);
      auVar16._4_4_ = local_58;
      auVar16._0_4_ = local_58;
      auVar16._8_4_ = local_58;
      auVar16._12_4_ = local_58;
      auVar9 = vsubps_avx(auVar9,auVar16);
      fVar12 = (float)local_48._0_4_ * 0.5;
      auVar14._0_4_ = (float)local_48._0_4_ * auVar9._0_4_;
      auVar14._4_4_ = (float)local_48._0_4_ * auVar9._4_4_;
      auVar14._8_4_ = (float)local_48._0_4_ * auVar9._8_4_;
      auVar14._12_4_ = (float)local_48._0_4_ * auVar9._12_4_;
      auVar9._8_4_ = 0x3c23d70a;
      auVar9._0_8_ = 0x3c23d70a3c23d70a;
      auVar9._12_4_ = 0x3c23d70a;
      auVar9 = vdivps_avx512vl(auVar14,auVar9);
      fVar17 = fVar17 + ((float)local_48._0_4_ * (FVar11 - local_58)) / 0.01;
      local_c8 = local_c8 * 2.01;
      local_b8 = local_b8 + auVar9._0_4_;
      fStack_b4 = fStack_b4 + auVar9._4_4_;
      fStack_b0 = fStack_b0 + auVar9._8_4_;
      fStack_ac = fStack_ac + auVar9._12_4_;
      bVar6 = false;
    } while (bVar7);
  }
  fVar12 = 0.5;
  local_c8 = 1.0;
  iVar8 = 5;
  auVar9 = ZEXT816(0) << 0x40;
  do {
    uStack_c4 = 0;
    uStack_c0 = 0;
    uStack_bc = 0;
    local_d8._0_4_ = auVar9._0_4_;
    local_e8.z = fVar17 * local_c8;
    auVar13._0_4_ = local_b8 * local_c8;
    auVar13._4_4_ = fStack_b4 * local_c8;
    auVar13._8_4_ = fStack_b0 * local_c8;
    auVar13._12_4_ = fStack_ac * local_c8;
    local_e8._0_8_ = vmovlps_avx(auVar13);
    auVar15._0_4_ = Noise((Point3f *)&local_e8);
    auVar15._4_60_ = extraout_var;
    iVar8 = iVar8 + -1;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)local_d8._0_4_),auVar15._0_16_,ZEXT416((uint)fVar12));
    local_c8 = local_c8 * 2.01;
    fVar12 = fVar12 * 0.5;
  } while (iVar8 != 0);
  fVar17 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar16 = ZEXT816(0) << 0x20;
  auVar3 = vmaxss_avx(ZEXT416((uint)(0.5 - fVar17)),auVar16);
  auVar14 = ZEXT416((uint)(auVar9._0_4_ * (1.0 - fVar17) * 4.5 * this->density));
  auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
  uVar5 = vcmpss_avx512f(auVar14,auVar16,1);
  auVar10._4_12_ = auVar9._4_12_;
  auVar10._0_4_ = (uint)!(bool)((byte)uVar5 & 1) * auVar9._0_4_;
  auVar3 = vfmadd231ss_fma(auVar10,auVar3,ZEXT416(0x40000000));
  auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar3);
  uVar5 = vcmpss_avx512f(auVar3,auVar16,1);
  iVar8 = (uint)!(bool)((byte)uVar5 & 1) * auVar9._0_4_;
  return (array<float,_4>)CONCAT88(CONCAT44((float)iVar8,(float)iVar8),CONCAT44(iVar8,iVar8));
}

Assistant:

Density(const Point3f &p, const SampledWavelengths &lambda) const {
        Point3f pp = 5 * extent * p;

        // Use noise to perturb the lookup point.
        if (wispiness > 0) {
            Float vscale = .05f * wispiness, vlac = 10.f;
            for (int i = 0; i < 2; ++i) {
                Float delta = .01f;
                // TODO: update Noise() to return the gradient?
                Float base = Noise(vlac * pp);
                Point3f pd(Noise(vlac * pp + Vector3f(delta, 0, 0)),
                           Noise(vlac * pp + Vector3f(0, delta, 0)),
                           Noise(vlac * pp + Vector3f(0, 0, delta)));
                pp += vscale * (pd - Vector3f(base, base, base)) / delta;
                vscale *= 0.5f;
                vlac *= 2.01f;
            }
        }

        Float d = 0;
        Float scale = .5, lac = 1.f;
        for (int i = 0; i < 5; ++i) {
            d += scale * Noise(lac * pp);
            scale *= 0.5f;
            lac *= 2.01f;
        }

        d = Clamp((1 - p.y) * 4.5f * density * d, 0, 1);
        d += 2 * std::max<Float>(0, .5f - p.y);
        return SampledSpectrum(Clamp(d, 0, 1));
    }